

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O3

void __thiscall
visitor_test_should_stop_in_strict_mode_when_encountering_an_unknown_tag_Test::
~visitor_test_should_stop_in_strict_mode_when_encountering_an_unknown_tag_Test
          (visitor_test_should_stop_in_strict_mode_when_encountering_an_unknown_tag_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(visitor_test, should_stop_in_strict_mode_when_encountering_an_unknown_tag)
{
    const char* frame = "8=FIX.4.2|9=0000|35=0|49=Prov|56=MDABC|221=A|10=213";

    auto error = doVisit(frame, AssertVisitor(), AssertVisitRules());
    ASSERT_FALSE(error.isOk());

    auto errorKind = error.unwrapErr();
    ASSERT_EQ(errorKind.type(), Fixpp::ErrorKind::UnknownTag);
    ASSERT_EQ(errorKind.asString(), "Encountered unknown tag 221");
}